

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void aom_comp_avg_pred_avx2
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  uint8_t *puVar5;
  int in_ECX;
  int in_EDX;
  undefined1 (*in_RSI) [32];
  uint8_t *in_RDI;
  undefined1 (*in_R8) [32];
  int in_R9D;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZMM1 [64];
  __m256i average_1_2;
  __m256i average_0_2;
  __m256i ref_1_3;
  __m256i ref_0_3;
  __m256i pred_1_2;
  __m256i pred_0_2;
  int x;
  __m256i average_1_1;
  __m256i average_0_1;
  __m256i ref_1_2;
  __m256i ref_0_2;
  __m256i pred_1_1;
  __m256i pred_0_1;
  __m256i average_1;
  __m256i average_0;
  __m256i ref_1_1;
  __m256i tmp1;
  __m256i ref_0_1;
  __m256i tmp0;
  __m256i pred_1;
  __m256i pred_0;
  __m256i average;
  __m256i ref_0123;
  __m128i ref_23;
  __m128i ref_01;
  __m128i ref_3;
  __m128i ref_2;
  __m128i ref_1;
  __m128i ref_0;
  __m256i pred_0123;
  int row;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  int local_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  int local_530;
  undefined1 (*local_528) [32];
  undefined1 (*local_518) [32];
  uint8_t *local_510;
  
  local_530 = 0;
  local_528 = in_R8;
  local_518 = in_RSI;
  local_510 = in_RDI;
  if (in_EDX == 8) {
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)*local_528;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(*local_528 + in_R9D);
      auVar7 = vpunpcklqdq_avx(auVar3,auVar7);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(*local_528 + in_R9D * 2);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(*local_528 + in_R9D * 3);
      auVar8 = vpunpcklqdq_avx(auVar6,auVar8);
      auVar6 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
      uStack_5d0 = auVar6._0_8_;
      uStack_5c8 = auVar6._8_8_;
      auVar4._16_8_ = uStack_5d0;
      auVar4._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar7;
      auVar4._24_8_ = uStack_5c8;
      auVar1 = vpavgb_avx2(*local_518,auVar4);
      local_600 = auVar1._0_8_;
      uStack_5f8 = auVar1._8_8_;
      uStack_5f0 = auVar1._16_8_;
      uStack_5e8 = auVar1._24_8_;
      *(undefined8 *)local_510 = local_600;
      *(undefined8 *)(local_510 + 8) = uStack_5f8;
      *(undefined8 *)(local_510 + 0x10) = uStack_5f0;
      *(undefined8 *)(local_510 + 0x18) = uStack_5e8;
      local_530 = local_530 + 4;
      local_518 = local_518 + 1;
      local_510 = local_510 + 0x20;
      local_528 = (undefined1 (*) [32])(*local_528 + (in_R9D << 2));
    } while (local_530 < in_ECX);
  }
  else if (in_EDX == 0x10) {
    do {
      auVar7 = ZEXT116(0) * in_ZMM1._0_16_ +
               ZEXT116(1) * *(undefined1 (*) [16])(*local_528 + in_R9D);
      auVar8 = ZEXT116(0) * in_ZMM1._0_16_ +
               ZEXT116(1) * *(undefined1 (*) [16])(*local_528 + in_R9D * 3);
      uStack_670 = auVar7._0_8_;
      uStack_668 = auVar7._8_8_;
      auVar1._16_8_ = uStack_670;
      auVar1._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*local_528 + in_R9D) +
           ZEXT116(1) * *(undefined1 (*) [16])*local_528;
      auVar1._24_8_ = uStack_668;
      auVar1 = vpavgb_avx2(*local_518,auVar1);
      uStack_6b0 = auVar8._0_8_;
      uStack_6a8 = auVar8._8_8_;
      auVar2._16_8_ = uStack_6b0;
      auVar2._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*local_528 + in_R9D * 3) +
           ZEXT116(1) * *(undefined1 (*) [16])(*local_528 + in_R9D * 2);
      auVar2._24_8_ = uStack_6a8;
      in_ZMM1 = ZEXT3264(auVar2);
      auVar2 = vpavgb_avx2(local_518[1],auVar2);
      local_6e0 = auVar1._0_8_;
      uStack_6d8 = auVar1._8_8_;
      uStack_6d0 = auVar1._16_8_;
      uStack_6c8 = auVar1._24_8_;
      *(undefined8 *)local_510 = local_6e0;
      *(undefined8 *)(local_510 + 8) = uStack_6d8;
      *(undefined8 *)(local_510 + 0x10) = uStack_6d0;
      *(undefined8 *)(local_510 + 0x18) = uStack_6c8;
      local_700 = auVar2._0_8_;
      uStack_6f8 = auVar2._8_8_;
      uStack_6f0 = auVar2._16_8_;
      uStack_6e8 = auVar2._24_8_;
      *(undefined8 *)(local_510 + 0x20) = local_700;
      *(undefined8 *)(local_510 + 0x28) = uStack_6f8;
      *(undefined8 *)(local_510 + 0x30) = uStack_6f0;
      *(undefined8 *)(local_510 + 0x38) = uStack_6e8;
      local_530 = local_530 + 4;
      local_518 = local_518 + 2;
      local_510 = local_510 + 0x40;
      local_528 = (undefined1 (*) [32])(*local_528 + (in_R9D << 2));
    } while (local_530 < in_ECX);
  }
  else if (in_EDX == 0x20) {
    do {
      auVar1 = vpavgb_avx2(*local_518,*local_528);
      auVar2 = vpavgb_avx2(local_518[1],*(undefined1 (*) [32])(*local_528 + in_R9D));
      local_7a0 = auVar1._0_8_;
      uStack_798 = auVar1._8_8_;
      uStack_790 = auVar1._16_8_;
      uStack_788 = auVar1._24_8_;
      *(undefined8 *)local_510 = local_7a0;
      *(undefined8 *)(local_510 + 8) = uStack_798;
      *(undefined8 *)(local_510 + 0x10) = uStack_790;
      *(undefined8 *)(local_510 + 0x18) = uStack_788;
      local_7c0 = auVar2._0_8_;
      uStack_7b8 = auVar2._8_8_;
      uStack_7b0 = auVar2._16_8_;
      uStack_7a8 = auVar2._24_8_;
      *(undefined8 *)(local_510 + 0x20) = local_7c0;
      *(undefined8 *)(local_510 + 0x28) = uStack_7b8;
      *(undefined8 *)(local_510 + 0x30) = uStack_7b0;
      *(undefined8 *)(local_510 + 0x38) = uStack_7a8;
      local_530 = local_530 + 2;
      local_518 = local_518 + 2;
      local_510 = local_510 + 0x40;
      local_528 = (undefined1 (*) [32])(*local_528 + (in_R9D << 1));
    } while (local_530 < in_ECX);
  }
  else if (in_EDX % 0x40 == 0) {
    do {
      for (local_7c4 = 0; local_7c4 < in_EDX; local_7c4 = local_7c4 + 0x40) {
        auVar1 = vpavgb_avx2(*(undefined1 (*) [32])(*local_518 + local_7c4),
                             *(undefined1 (*) [32])(*local_528 + local_7c4));
        auVar2 = vpavgb_avx2(*(undefined1 (*) [32])(local_518[1] + local_7c4),
                             *(undefined1 (*) [32])(local_528[1] + local_7c4));
        puVar5 = local_510 + local_7c4;
        local_880 = auVar1._0_8_;
        uStack_878 = auVar1._8_8_;
        uStack_870 = auVar1._16_8_;
        uStack_868 = auVar1._24_8_;
        *(undefined8 *)puVar5 = local_880;
        *(undefined8 *)(puVar5 + 8) = uStack_878;
        *(undefined8 *)(puVar5 + 0x10) = uStack_870;
        *(undefined8 *)(puVar5 + 0x18) = uStack_868;
        local_8a0 = auVar2._0_8_;
        uStack_898 = auVar2._8_8_;
        uStack_890 = auVar2._16_8_;
        uStack_888 = auVar2._24_8_;
        *(undefined8 *)(local_510 + (long)local_7c4 + 0x20) = local_8a0;
        *(undefined8 *)(local_510 + (long)local_7c4 + 0x28) = uStack_898;
        *(undefined8 *)(local_510 + (long)local_7c4 + 0x30) = uStack_890;
        *(undefined8 *)(local_510 + (long)local_7c4 + 0x38) = uStack_888;
      }
      local_530 = local_530 + 1;
      local_518 = (undefined1 (*) [32])(*local_518 + in_EDX);
      local_510 = local_510 + in_EDX;
      local_528 = (undefined1 (*) [32])(*local_528 + in_R9D);
    } while (local_530 < in_ECX);
  }
  else {
    aom_comp_avg_pred_c(in_RDI,(uint8_t *)in_RSI,in_EDX,in_ECX,(uint8_t *)in_R8,in_R9D);
  }
  return;
}

Assistant:

void aom_comp_avg_pred_avx2(uint8_t *comp_pred, const uint8_t *pred, int width,
                            int height, const uint8_t *ref, int ref_stride) {
  int row = 0;
  if (width == 8) {
    do {
      const __m256i pred_0123 = _mm256_loadu_si256((const __m256i *)(pred));
      const __m128i ref_0 = _mm_loadl_epi64((const __m128i *)(ref));
      const __m128i ref_1 =
          _mm_loadl_epi64((const __m128i *)(ref + ref_stride));
      const __m128i ref_2 =
          _mm_loadl_epi64((const __m128i *)(ref + 2 * ref_stride));
      const __m128i ref_3 =
          _mm_loadl_epi64((const __m128i *)(ref + 3 * ref_stride));
      const __m128i ref_01 = _mm_unpacklo_epi64(ref_0, ref_1);
      const __m128i ref_23 = _mm_unpacklo_epi64(ref_2, ref_3);

      const __m256i ref_0123 =
          _mm256_inserti128_si256(_mm256_castsi128_si256(ref_01), ref_23, 1);
      const __m256i average = _mm256_avg_epu8(pred_0123, ref_0123);
      _mm256_storeu_si256((__m256i *)(comp_pred), average);

      row += 4;
      pred += 32;
      comp_pred += 32;
      ref += 4 * ref_stride;
    } while (row < height);
  } else if (width == 16) {
    do {
      const __m256i pred_0 = _mm256_loadu_si256((const __m256i *)(pred));
      const __m256i pred_1 = _mm256_loadu_si256((const __m256i *)(pred + 32));
      const __m256i tmp0 =
          _mm256_castsi128_si256(_mm_loadu_si128((const __m128i *)(ref)));
      const __m256i ref_0 = _mm256_inserti128_si256(
          tmp0, _mm_loadu_si128((const __m128i *)(ref + ref_stride)), 1);
      const __m256i tmp1 = _mm256_castsi128_si256(
          _mm_loadu_si128((const __m128i *)(ref + 2 * ref_stride)));
      const __m256i ref_1 = _mm256_inserti128_si256(
          tmp1, _mm_loadu_si128((const __m128i *)(ref + 3 * ref_stride)), 1);
      const __m256i average_0 = _mm256_avg_epu8(pred_0, ref_0);
      const __m256i average_1 = _mm256_avg_epu8(pred_1, ref_1);
      _mm256_storeu_si256((__m256i *)(comp_pred), average_0);
      _mm256_storeu_si256((__m256i *)(comp_pred + 32), average_1);

      row += 4;
      pred += 64;
      comp_pred += 64;
      ref += 4 * ref_stride;
    } while (row < height);
  } else if (width == 32) {
    do {
      const __m256i pred_0 = _mm256_loadu_si256((const __m256i *)(pred));
      const __m256i pred_1 = _mm256_loadu_si256((const __m256i *)(pred + 32));
      const __m256i ref_0 = _mm256_loadu_si256((const __m256i *)(ref));
      const __m256i ref_1 =
          _mm256_loadu_si256((const __m256i *)(ref + ref_stride));
      const __m256i average_0 = _mm256_avg_epu8(pred_0, ref_0);
      const __m256i average_1 = _mm256_avg_epu8(pred_1, ref_1);
      _mm256_storeu_si256((__m256i *)(comp_pred), average_0);
      _mm256_storeu_si256((__m256i *)(comp_pred + 32), average_1);

      row += 2;
      pred += 64;
      comp_pred += 64;
      ref += 2 * ref_stride;
    } while (row < height);
  } else if (width % 64 == 0) {
    do {
      for (int x = 0; x < width; x += 64) {
        const __m256i pred_0 = _mm256_loadu_si256((const __m256i *)(pred + x));
        const __m256i pred_1 =
            _mm256_loadu_si256((const __m256i *)(pred + x + 32));
        const __m256i ref_0 = _mm256_loadu_si256((const __m256i *)(ref + x));
        const __m256i ref_1 =
            _mm256_loadu_si256((const __m256i *)(ref + x + 32));
        const __m256i average_0 = _mm256_avg_epu8(pred_0, ref_0);
        const __m256i average_1 = _mm256_avg_epu8(pred_1, ref_1);
        _mm256_storeu_si256((__m256i *)(comp_pred + x), average_0);
        _mm256_storeu_si256((__m256i *)(comp_pred + x + 32), average_1);
      }
      row++;
      pred += width;
      comp_pred += width;
      ref += ref_stride;
    } while (row < height);
  } else {
    aom_comp_avg_pred_c(comp_pred, pred, width, height, ref, ref_stride);
  }
}